

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

VarStatus __thiscall soplex::SoPlexBase<double>::basisRowStatus(SoPlexBase<double> *this,int row)

{
  VarStatus VVar1;
  
  VVar1 = BASIC;
  if (((-1 < row) && (this->_hasBasis != false)) &&
     (row < (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum)) {
    if (this->_isRealLPLoaded == true) {
      VVar1 = SPxSolverBase<double>::getBasisRowStatus(&this->_solver,row);
      return VVar1;
    }
    VVar1 = (this->_basisStatusRows).data[(uint)row];
  }
  return VVar1;
}

Assistant:

typename SPxSolverBase<R>::VarStatus SoPlexBase<R>::basisRowStatus(int row) const
{
   assert(row >= 0);
   assert(row < numRows());

   // if no basis is available, return slack basis; if index is out of range, return basic status as for a newly
   // added row
   if(!hasBasis() || row < 0 || row >= numRows())
      return SPxSolverBase<R>::BASIC;
   // if the real LP is loaded, ask solver
   else if(_isRealLPLoaded)
   {
      return _solver.getBasisRowStatus(row);
   }
   // if the real LP is not loaded, the basis is stored in the basis arrays of this class
   else
   {
      assert(row < _basisStatusRows.size());
      return _basisStatusRows[row];
   }
}